

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O2

bool tcu::isGatherOffsetsCompareResultValid
               (ConstPixelBufferAccess *texture,Sampler *sampler,TexComparePrecision *prec,
               Vec2 *coord,int coordZ,IVec2 (*offsets) [4],float cmpReference,Vec4 *result)

{
  int size;
  int size_00;
  bool isFixedPoint;
  bool bVar1;
  CmpResultSet resultSet;
  int i_00;
  int j;
  int i;
  int iVar2;
  int iVar3;
  int offNdx;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vec2 vBounds;
  Vec2 uBounds;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  isFixedPoint = isFixedPointDepthTextureFormat(&texture->m_format);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(texture->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(texture->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar5 = floorf(local_38 + -0.5);
  fVar6 = floorf(local_34 + -0.5);
  fVar7 = floorf(local_40 + -0.5);
  fVar8 = floorf(local_3c + -0.5);
  size = (texture->m_size).m_data[0];
  size_00 = (texture->m_size).m_data[1];
  for (iVar2 = (int)fVar7; iVar3 = (int)fVar5, iVar2 <= (int)fVar8; iVar2 = iVar2 + 1) {
    while (iVar3 <= (int)fVar6) {
      bVar1 = true;
      uVar4 = 0;
      while ((uVar4 < 4 && (bVar1 != false))) {
        i_00 = TexVerifierUtil::wrap(sampler->wrapS,(*offsets)[uVar4].m_data[0] + iVar3,size);
        j = TexVerifierUtil::wrap(sampler->wrapT,(*offsets)[uVar4].m_data[1] + iVar2,size_00);
        fVar7 = lookupDepth(texture,sampler,i_00,j,coordZ);
        resultSet = execCompare(sampler->compare,fVar7,cmpReference,prec->referenceBits,isFixedPoint
                               );
        bVar1 = isResultInSet(resultSet,result->m_data[uVar4],prec->resultBits);
        uVar4 = uVar4 + 1;
      }
      iVar3 = iVar3 + 1;
      if (bVar1 != false) goto LAB_008f7743;
    }
  }
LAB_008f7743:
  return iVar2 <= (int)fVar8;
}

Assistant:

static bool isGatherOffsetsCompareResultValid (const ConstPixelBufferAccess&	texture,
											   const Sampler&					sampler,
											   const TexComparePrecision&		prec,
											   const Vec2&						coord,
											   int								coordZ,
											   const IVec2						(&offsets)[4],
											   float							cmpReference,
											   const Vec4&						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(texture.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, texture.getWidth(),		coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, texture.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI				= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI				= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ				= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ				= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w					= texture.getWidth();
	const int	h					= texture.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			bool isCurrentPixelValid = true;

			for (int offNdx = 0; offNdx < 4 && isCurrentPixelValid; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int			x		= wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int			y		= wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				const float			depth	= lookupDepth(texture, sampler, x, y, coordZ);
				const CmpResultSet	resSet	= execCompare(sampler.compare, depth, cmpReference, prec.referenceBits, isFixedPointDepth);

				if (!isResultInSet(resSet, result[offNdx], prec.resultBits))
					isCurrentPixelValid = false;
			}

			if (isCurrentPixelValid)
				return true;
		}
	}

	return false;
}